

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerBinaryCastLoop<duckdb::IntegerDecimalCastData<unsigned_int>,false,false,duckdb::IntegerDecimalCastOperation>
               (char *buf,idx_t len,IntegerDecimalCastData<unsigned_int> *result,bool strict)

{
  char cVar1;
  bool bVar2;
  IntegerDecimalCastData<unsigned_int> *in_RSI;
  long in_RDI;
  char current_char;
  uint8_t digit;
  idx_t pos;
  idx_t start_pos;
  uint8_t digit_00;
  IntegerDecimalCastData<unsigned_int> *state;
  IntegerDecimalCastData<unsigned_int> *state_00;
  
  state_00 = (IntegerDecimalCastData<unsigned_int> *)0x1;
  while( true ) {
    if (in_RSI <= state_00) {
      bVar2 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(state_00);
      if (!bVar2) {
        return false;
      }
      return (IntegerDecimalCastData<unsigned_int> *)0x1 < state_00;
    }
    cVar1 = *(char *)((long)&state_00->result + in_RDI);
    if (cVar1 == '0') {
      digit_00 = '\0';
    }
    else {
      if (cVar1 != '1') {
        return false;
      }
      digit_00 = '\x01';
    }
    state = (IntegerDecimalCastData<unsigned_int> *)((long)&state_00->result + 1);
    if (((state != in_RSI) && (*(char *)((long)&state->result + in_RDI) == '_')) &&
       ((state = (IntegerDecimalCastData<unsigned_int> *)((long)&state_00->result + 2),
        state == in_RSI ||
        ((*(char *)((long)&state->result + in_RDI) != '0' &&
         (*(char *)((long)&state->result + in_RDI) != '1')))))) break;
    bVar2 = IntegerCastOperation::
            HandleBinaryDigit<duckdb::IntegerDecimalCastData<unsigned_int>,false>(state,digit_00);
    state_00 = state;
    if (!bVar2) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool IntegerBinaryCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	if (ALLOW_EXPONENT || NEGATIVE) {
		return false;
	}
	idx_t start_pos = 1;
	idx_t pos = start_pos;
	uint8_t digit;
	char current_char;
	while (pos < len) {
		current_char = buf[pos];
		if (current_char == '0') {
			digit = 0;
		} else if (current_char == '1') {
			digit = 1;
		} else {
			return false;
		}
		pos++;
		if (pos != len && buf[pos] == '_') {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || (buf[pos] != '0' && buf[pos] != '1')) {
				return false;
			}
		}

		if (!OP::template HandleBinaryDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}